

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

void __thiscall player_t::Serialize(player_t *this,FSerializer *arc)

{
  userinfo_t *info;
  FSerializer *pFVar1;
  FString skinname;
  
  skinname.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  pFVar1 = FSerializer::operator()(arc,"class",&this->cls);
  pFVar1 = FSerializer::operator()(pFVar1,"mo",&this->mo);
  pFVar1 = FSerializer::operator()(pFVar1,"camera",&this->camera);
  pFVar1 = FSerializer::operator()(pFVar1,"playerstate",&this->playerstate);
  FSerializer::operator()(pFVar1,"cmd",&this->cmd);
  info = &this->userinfo;
  if (arc->r == (FReader *)0x0) {
    WriteUserInfo(arc,info);
  }
  else {
    ReadUserInfo(arc,info,&skinname);
  }
  pFVar1 = FSerializer::operator()(arc,"desiredfov",&this->DesiredFOV);
  pFVar1 = FSerializer::operator()(pFVar1,"fov",&this->FOV);
  pFVar1 = FSerializer::operator()(pFVar1,"viewz",&this->viewz);
  pFVar1 = FSerializer::operator()(pFVar1,"viewheight",&this->viewheight);
  pFVar1 = FSerializer::operator()(pFVar1,"deltaviewheight",&this->deltaviewheight);
  pFVar1 = FSerializer::operator()(pFVar1,"bob",&this->bob);
  pFVar1 = FSerializer::operator()(pFVar1,"vel",&this->Vel);
  pFVar1 = FSerializer::operator()(pFVar1,"centering",&this->centering);
  pFVar1 = FSerializer::operator()(pFVar1,"health",&this->health);
  pFVar1 = FSerializer::operator()(pFVar1,"inventorytics",&this->inventorytics);
  pFVar1 = FSerializer::operator()(pFVar1,"fragcount",&this->fragcount);
  pFVar1 = FSerializer::operator()(pFVar1,"spreecount",&this->spreecount);
  pFVar1 = FSerializer::operator()(pFVar1,"multicount",&this->multicount);
  pFVar1 = FSerializer::operator()(pFVar1,"lastkilltime",&this->lastkilltime);
  pFVar1 = FSerializer::operator()(pFVar1,"readyweapon",&this->ReadyWeapon);
  pFVar1 = FSerializer::operator()(pFVar1,"pendingweapon",&this->PendingWeapon);
  pFVar1 = FSerializer::operator()(pFVar1,"cheats",&this->cheats);
  pFVar1 = FSerializer::operator()(pFVar1,"refire",&this->refire);
  pFVar1 = FSerializer::operator()(pFVar1,"inconsistant",&this->inconsistant);
  pFVar1 = FSerializer::operator()(pFVar1,"killcount",&this->killcount);
  pFVar1 = FSerializer::operator()(pFVar1,"itemcount",&this->itemcount);
  pFVar1 = FSerializer::operator()(pFVar1,"secretcount",&this->secretcount);
  pFVar1 = FSerializer::operator()(pFVar1,"damagecount",&this->damagecount);
  pFVar1 = FSerializer::operator()(pFVar1,"bonuscount",&this->bonuscount);
  pFVar1 = FSerializer::operator()(pFVar1,"hazardcount",&this->hazardcount);
  pFVar1 = FSerializer::operator()(pFVar1,"poisoncount",&this->poisoncount);
  pFVar1 = FSerializer::operator()(pFVar1,"poisoner",&this->poisoner);
  pFVar1 = FSerializer::operator()(pFVar1,"attacker",&this->attacker);
  pFVar1 = FSerializer::operator()(pFVar1,"extralight",&this->extralight);
  pFVar1 = FSerializer::operator()(pFVar1,"fixedcolormap",&this->fixedcolormap);
  pFVar1 = FSerializer::operator()(pFVar1,"fixedlightlevel",&this->fixedlightlevel);
  pFVar1 = FSerializer::operator()(pFVar1,"morphTics",&this->morphTics);
  pFVar1 = FSerializer::operator()(pFVar1,"morphedplayerclass",&this->MorphedPlayerClass);
  pFVar1 = FSerializer::operator()(pFVar1,"morphstyle",&this->MorphStyle);
  pFVar1 = FSerializer::operator()(pFVar1,"morphexitflash",&this->MorphExitFlash);
  pFVar1 = FSerializer::operator()(pFVar1,"premorphweapon",&this->PremorphWeapon);
  pFVar1 = FSerializer::operator()(pFVar1,"chickenpeck",&this->chickenPeck);
  pFVar1 = FSerializer::operator()(pFVar1,"jumptics",&this->jumpTics);
  pFVar1 = FSerializer::operator()(pFVar1,"respawntime",&this->respawn_time);
  pFVar1 = FSerializer::operator()(pFVar1,"airfinished",&this->air_finished);
  pFVar1 = FSerializer::operator()(pFVar1,"turnticks",&this->turnticks);
  pFVar1 = FSerializer::operator()(pFVar1,"oldbuttons",&this->oldbuttons);
  pFVar1 = FSerializer::operator()(pFVar1,"hazardtype",&this->hazardtype);
  pFVar1 = FSerializer::operator()(pFVar1,"hazardinterval",&this->hazardinterval);
  pFVar1 = FSerializer::operator()(pFVar1,"bot",&this->Bot);
  pFVar1 = FSerializer::operator()(pFVar1,"blendr",&this->BlendR);
  pFVar1 = FSerializer::operator()(pFVar1,"blendg",&this->BlendG);
  pFVar1 = FSerializer::operator()(pFVar1,"blendb",&this->BlendB);
  pFVar1 = FSerializer::operator()(pFVar1,"blenda",&this->BlendA);
  pFVar1 = FSerializer::operator()(pFVar1,"weaponstate",&this->WeaponState);
  pFVar1 = FSerializer::operator()(pFVar1,"logtext",&this->LogText);
  pFVar1 = FSerializer::operator()(pFVar1,"conversionnpc",&this->ConversationNPC);
  pFVar1 = FSerializer::operator()(pFVar1,"conversionpc",&this->ConversationPC);
  pFVar1 = FSerializer::operator()(pFVar1,"conversionnpcangle",&this->ConversationNPCAngle);
  pFVar1 = FSerializer::operator()(pFVar1,"conversionfacetalker",&this->ConversationFaceTalker);
  pFVar1 = FSerializer::Array<int>(pFVar1,"frags",this->frags,8,false);
  pFVar1 = FSerializer::operator()(pFVar1,"psprites",&this->psprites);
  pFVar1 = FSerializer::operator()(pFVar1,"currentplayerclass",&this->CurrentPlayerClass);
  pFVar1 = FSerializer::operator()(pFVar1,"crouchfactor",&this->crouchfactor);
  pFVar1 = FSerializer::operator()(pFVar1,"crouching",&this->crouching);
  pFVar1 = FSerializer::operator()(pFVar1,"crouchdir",&this->crouchdir);
  pFVar1 = FSerializer::operator()(pFVar1,"crouchviewdelta",&this->crouchviewdelta);
  pFVar1 = FSerializer::operator()(pFVar1,"original_cmd",&this->original_cmd);
  pFVar1 = FSerializer::operator()(pFVar1,"original_oldbuttons",&this->original_oldbuttons);
  pFVar1 = FSerializer::operator()(pFVar1,"poisontype",&this->poisontype);
  pFVar1 = FSerializer::operator()(pFVar1,"poisonpaintype",&this->poisonpaintype);
  pFVar1 = FSerializer::operator()(pFVar1,"timefreezer",&this->timefreezer);
  pFVar1 = FSerializer::operator()(pFVar1,"settings_controller",&this->settings_controller);
  pFVar1 = FSerializer::operator()(pFVar1,"onground",&this->onground);
  pFVar1 = FSerializer::operator()(pFVar1,"musinfoactor",&this->MUSINFOactor);
  FSerializer::operator()(pFVar1,"musinfotics",&this->MUSINFOtics);
  if (arc->w != (FWriter *)0x0) {
    this->oldbuttons = 0xffffffff;
    this->original_oldbuttons = 0xffffffff;
  }
  if (*(int *)(skinname.Chars + -0xc) != 0) {
    userinfo_t::SkinChanged(info,skinname.Chars,(uint)this->CurrentPlayerClass);
  }
  FString::~FString(&skinname);
  return;
}

Assistant:

void player_t::Serialize(FSerializer &arc)
{
	FString skinname;

	arc("class", cls)
		("mo", mo)
		("camera", camera)
		("playerstate", playerstate)
		("cmd", cmd);

	if (arc.isReading())
	{
		ReadUserInfo(arc, userinfo, skinname);
	}
	else
	{
		WriteUserInfo(arc, userinfo);
	}

	arc("desiredfov", DesiredFOV)
		("fov", FOV)
		("viewz", viewz)
		("viewheight", viewheight)
		("deltaviewheight", deltaviewheight)
		("bob", bob)
		("vel", Vel)
		("centering", centering)
		("health", health)
		("inventorytics", inventorytics)
		("fragcount", fragcount)
		("spreecount", spreecount)
		("multicount", multicount)
		("lastkilltime", lastkilltime)
		("readyweapon", ReadyWeapon)
		("pendingweapon", PendingWeapon)
		("cheats", cheats)
		("refire", refire)
		("inconsistant", inconsistant)
		("killcount", killcount)
		("itemcount", itemcount)
		("secretcount", secretcount)
		("damagecount", damagecount)
		("bonuscount", bonuscount)
		("hazardcount", hazardcount)
		("poisoncount", poisoncount)
		("poisoner", poisoner)
		("attacker", attacker)
		("extralight", extralight)
		("fixedcolormap", fixedcolormap)
		("fixedlightlevel", fixedlightlevel)
		("morphTics", morphTics)
		("morphedplayerclass", MorphedPlayerClass)
		("morphstyle", MorphStyle)
		("morphexitflash", MorphExitFlash)
		("premorphweapon", PremorphWeapon)
		("chickenpeck", chickenPeck)
		("jumptics", jumpTics)
		("respawntime", respawn_time)
		("airfinished", air_finished)
		("turnticks", turnticks)
		("oldbuttons", oldbuttons)
		("hazardtype", hazardtype)
		("hazardinterval", hazardinterval)
		("bot", Bot)
		("blendr", BlendR)
		("blendg", BlendG)
		("blendb", BlendB)
		("blenda", BlendA)
		("weaponstate", WeaponState)
		("logtext", LogText)
		("conversionnpc", ConversationNPC)
		("conversionpc", ConversationPC)
		("conversionnpcangle", ConversationNPCAngle)
		("conversionfacetalker", ConversationFaceTalker)
		.Array("frags", frags, MAXPLAYERS)
		("psprites", psprites)
		("currentplayerclass", CurrentPlayerClass)
		("crouchfactor", crouchfactor)
		("crouching", crouching)
		("crouchdir", crouchdir)
		("crouchviewdelta", crouchviewdelta)
		("original_cmd", original_cmd)
		("original_oldbuttons", original_oldbuttons)
		("poisontype", poisontype)
		("poisonpaintype", poisonpaintype)
		("timefreezer", timefreezer)
		("settings_controller", settings_controller)
		("onground", onground)
		("musinfoactor", MUSINFOactor)
		("musinfotics", MUSINFOtics);

	if (arc.isWriting ())
	{
		// If the player reloaded because they pressed +use after dying, we
		// don't want +use to still be down after the game is loaded.
		oldbuttons = ~0;
		original_oldbuttons = ~0;
	}
	if (skinname.IsNotEmpty())
	{
		userinfo.SkinChanged(skinname, CurrentPlayerClass);
	}
}